

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void __thiscall
spatial_region::add_beam
          (spatial_region *this,double cmr,double n0,double u0,double xb,double rb,double x0b,
          double y0b,double phib)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  celle *pcVar9;
  cellb *pcVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int i;
  long lVar30;
  int j;
  int iVar31;
  long lVar32;
  long lVar33;
  int k;
  long lVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar61 [64];
  undefined1 in_register_00001308 [56];
  undefined1 auVar62 [64];
  ulong in_XMM5_Qb;
  ulong in_XMM6_Qb;
  double dVar63;
  undefined8 in_XMM8_Qb;
  undefined1 local_198 [16];
  undefined1 local_158 [16];
  int_vector3d local_124;
  double local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  double local_d8;
  ulong uStack_d0;
  double local_c8;
  ulong uStack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double dStack_80;
  int_vector3d local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_58;
  ulong uStack_50;
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  
  auVar62._8_56_ = in_register_00001308;
  auVar62._0_8_ = rb;
  auVar61._8_56_ = in_register_000012c8;
  auVar61._0_8_ = xb;
  local_78.i = this->xnpic;
  local_78.j = this->ynpic;
  local_48 = auVar61._0_16_;
  local_e8 = auVar62._0_16_;
  local_78.k = this->znpic;
  lVar30 = 0;
  dVar63 = (double)(int)((uint)(0.0 < cmr) - (uint)(cmr < 0.0));
  local_c8 = -y0b;
  uStack_c0 = in_XMM6_Qb ^ 0x8000000000000000;
  local_d8 = -x0b;
  uStack_d0 = in_XMM5_Qb ^ 0x8000000000000000;
  local_58 = -xb;
  uStack_50 = in_register_000012c8._0_8_ ^ 0x8000000000000000;
  auVar12 = vunpcklpd_avx(local_48,local_e8);
  local_88 = auVar12._0_8_ * auVar12._0_8_;
  dStack_80 = auVar12._8_8_ * auVar12._8_8_;
  local_a8 = n0 * 0.5;
  local_b0 = (rb + rb) * rb;
  dVar11 = dVar63 * (double)(int)((uint)(0.0 < u0) - (uint)(u0 < 0.0));
  local_b8 = n0 * 0.25;
  local_68 = 0x3ff0000000000000;
  uStack_60 = 0x3ff0000000000000;
  local_a0 = cmr;
  local_98 = n0;
  for (; lVar30 < this->nx; lVar30 = lVar30 + 1) {
    dVar37 = (double)(int)lVar30;
    for (lVar32 = 0; lVar32 < this->ny; lVar32 = lVar32 + 1) {
      lVar33 = 0;
      for (lVar34 = 0; lVar34 < this->nz; lVar34 = lVar34 + 1) {
        iVar31 = (int)lVar32;
        auVar24._8_8_ = uStack_c0;
        auVar24._0_8_ = local_c8;
        auVar21._8_8_ = uStack_d0;
        auVar21._0_8_ = local_d8;
        auVar41._0_8_ = (double)(this->ny / -2 + iVar31);
        auVar41._8_8_ = in_XMM8_Qb;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = this->dy;
        auVar12 = vfmadd132sd_fma(auVar41,auVar24,auVar12);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = this->dx;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar37;
        auVar36 = vfmadd132sd_fma(auVar53,auVar21,auVar36);
        local_124.i = (int)lVar30;
        local_124.j = iVar31;
        local_124.k = (int)lVar34;
        dVar38 = atan2(auVar12._0_8_,auVar36._0_8_);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = this->dx;
        auVar22._8_8_ = uStack_d0;
        auVar22._0_8_ = local_d8;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = dVar37;
        auVar12 = vfmadd132sd_fma(auVar54,auVar22,auVar1);
        auVar25._8_8_ = uStack_c0;
        auVar25._0_8_ = local_c8;
        auVar59._0_8_ = (double)(this->ny / -2 + iVar31);
        auVar59._8_8_ = in_XMM8_Qb;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = this->dy;
        auVar36 = vfmadd132sd_fma(auVar59,auVar25,auVar2);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = auVar36._0_8_ * auVar36._0_8_;
        auVar12 = vfmadd231sd_fma(auVar60,auVar12,auVar12);
        auVar12 = vsqrtsd_avx(auVar12,auVar12);
        dVar39 = cos(dVar38 - phib);
        dVar39 = dVar39 * auVar12._0_8_;
        auVar23._8_8_ = uStack_d0;
        auVar23._0_8_ = local_d8;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = this->dx;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = dVar37;
        auVar12 = vfmadd132sd_fma(auVar42,auVar23,auVar3);
        auVar26._8_8_ = uStack_c0;
        auVar26._0_8_ = local_c8;
        auVar55._0_8_ = (double)(this->ny / -2 + iVar31);
        auVar55._8_8_ = in_XMM8_Qb;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = this->dy;
        auVar36 = vfmadd132sd_fma(auVar55,auVar26,auVar4);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = auVar36._0_8_ * auVar36._0_8_;
        auVar12 = vfmadd231sd_fma(auVar56,auVar12,auVar12);
        auVar12 = vsqrtsd_avx(auVar12,auVar12);
        local_118 = auVar12._0_8_;
        dVar38 = sin(dVar38 - phib);
        dVar38 = dVar38 * local_118;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = dVar38;
        local_118 = (double)(this->nz / -2 + (int)lVar34) * this->dz;
        uStack_110 = 0;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = local_118 * local_118;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = dVar38;
        auVar12 = vfmadd231sd_fma(auVar43,auVar57,auVar58);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar39;
        auVar29._8_8_ = uStack_50;
        auVar29._0_8_ = local_58;
        uVar13 = vcmppd_avx512vl(auVar16,auVar29,0xe);
        auVar12 = vsqrtsd_avx(auVar12,auVar12);
        dVar40 = auVar12._0_8_;
        uVar35 = vcmppd_avx512vl(auVar16,local_48,1);
        uVar35 = ((byte)uVar13 & 3) & uVar35;
        if (((uVar35 & 1) != 0) && (dVar40 < local_e8._0_8_)) {
          auVar36 = vunpcklpd_avx(auVar16,auVar12);
          auVar28._8_8_ = uStack_60;
          auVar28._0_8_ = local_68;
          auVar44._0_8_ = auVar36._0_8_ * auVar36._0_8_;
          auVar44._8_8_ = auVar36._8_8_ * auVar36._8_8_;
          auVar27._8_8_ = dStack_80;
          auVar27._0_8_ = local_88;
          auVar36 = vdivpd_avx(auVar44,auVar27);
          auVar1 = vsubpd_avx(auVar28,auVar36);
          auVar36 = vshufpd_avx(auVar1,auVar1,1);
          local_108._0_8_ = auVar1._0_8_ * local_98 * auVar36._0_8_;
          local_f8 = auVar12;
          local_90 = cos(phib);
          local_90 = local_90 * u0;
          dVar40 = sin(phib);
          fill_cell_by_particles
                    (this,local_a0,&local_124,&local_78,(double)local_108._0_8_,local_90,dVar40 * u0
                     ,0.0,0.0);
          auVar12 = vpermilpd_avx(auVar44,1);
          dVar40 = auVar1._0_8_ * local_a8 * (1.0 - auVar12._0_8_ / local_b0);
          auVar45._0_8_ = sin(phib);
          auVar45._8_56_ = extraout_var;
          local_158._0_8_ = dVar40 * dVar63;
          pcVar9 = (this->ce).p._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar30][lVar32];
          local_158._8_8_ = 0;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)((long)&pcVar9->ex + lVar33);
          local_108._8_8_ = 0;
          local_108._0_8_ = (double)local_158._0_8_ * dVar38;
          auVar12 = vfnmadd213sd_fma(auVar45._0_16_,local_108,auVar5);
          *(long *)((long)&pcVar9->ex + lVar33) = auVar12._0_8_;
          auVar46._0_8_ = cos(phib);
          auVar46._8_56_ = extraout_var_00;
          auVar19._8_8_ = uStack_110;
          auVar19._0_8_ = local_118;
          auVar12 = vunpcklpd_avx(local_108,local_158);
          auVar36 = vunpcklpd_avx(auVar46._0_16_,auVar19);
          pcVar9 = (this->ce).p._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar30][lVar32];
          auVar12 = vfmadd213pd_fma(auVar36,auVar12,
                                    *(undefined1 (*) [16])((long)&pcVar9->ey + lVar33));
          *(undefined1 (*) [16])((long)&pcVar9->ey + lVar33) = auVar12;
          local_158._0_8_ = dVar40 * dVar11;
          local_158._8_8_ = 0;
          local_198._8_8_ = 0;
          local_198._0_8_ = local_118 * (double)local_158._0_8_;
          auVar47._0_8_ = sin(phib);
          auVar47._8_56_ = extraout_var_01;
          pcVar10 = (this->cb).p._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar30][lVar32];
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)((long)&pcVar10->bx + lVar33);
          auVar12 = vfmadd213sd_fma(auVar47._0_16_,local_198,auVar6);
          *(long *)((long)&pcVar10->bx + lVar33) = auVar12._0_8_;
          auVar48._0_8_ = cos(phib);
          auVar48._8_56_ = extraout_var_02;
          auVar12 = vunpcklpd_avx(auVar48._0_16_,auVar57);
          dVar40 = local_f8._0_8_;
          auVar14._8_8_ = 0x8000000000000000;
          auVar14._0_8_ = 0x8000000000000000;
          auVar36 = vxorpd_avx512vl(local_198,auVar14);
          auVar36 = vunpcklpd_avx(auVar36,local_158);
          pcVar10 = (this->cb).p._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar30][lVar32];
          auVar12 = vfmadd213pd_fma(auVar12,auVar36,
                                    *(undefined1 (*) [16])((long)&pcVar10->by + lVar33));
          *(undefined1 (*) [16])((long)&pcVar10->by + lVar33) = auVar12;
        }
        if (((double)local_e8._0_8_ <= dVar40 & (byte)uVar35) == 1) {
          dVar39 = ((1.0 - (dVar39 * dVar39) / local_88) * local_b8 * (double)local_e8._0_8_ *
                   (double)local_e8._0_8_) / (dVar40 * dVar40);
          auVar49._0_8_ = sin(phib);
          auVar49._8_56_ = extraout_var_03;
          local_198._0_8_ = dVar39 * dVar63;
          pcVar9 = (this->ce).p._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar30][lVar32];
          local_198._8_8_ = 0;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)((long)&pcVar9->ex + lVar33);
          local_f8._8_8_ = 0;
          local_f8._0_8_ = (double)local_198._0_8_ * dVar38;
          auVar12 = vfnmadd213sd_fma(auVar49._0_16_,local_f8,auVar7);
          *(long *)((long)&pcVar9->ex + lVar33) = auVar12._0_8_;
          auVar50._0_8_ = cos(phib);
          auVar50._8_56_ = extraout_var_04;
          auVar20._8_8_ = uStack_110;
          auVar20._0_8_ = local_118;
          auVar12 = vunpcklpd_avx(local_f8,local_198);
          auVar36 = vunpcklpd_avx(auVar50._0_16_,auVar20);
          pcVar9 = (this->ce).p._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar30][lVar32];
          auVar12 = vfmadd213pd_fma(auVar36,auVar12,
                                    *(undefined1 (*) [16])((long)&pcVar9->ey + lVar33));
          *(undefined1 (*) [16])((long)&pcVar9->ey + lVar33) = auVar12;
          local_198._0_8_ = dVar39 * dVar11;
          local_198._8_8_ = 0;
          dVar39 = local_118 * (double)local_198._0_8_;
          auVar51._0_8_ = sin(phib);
          auVar51._8_56_ = extraout_var_05;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar39;
          pcVar10 = (this->cb).p._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar30][lVar32];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)((long)&pcVar10->bx + lVar33);
          auVar12 = vfmadd213sd_fma(auVar51._0_16_,auVar17,auVar8);
          *(long *)((long)&pcVar10->bx + lVar33) = auVar12._0_8_;
          auVar52._0_8_ = cos(phib);
          auVar52._8_56_ = extraout_var_06;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar39;
          auVar12 = vunpcklpd_avx(auVar52._0_16_,auVar57);
          auVar15._8_8_ = 0x8000000000000000;
          auVar15._0_8_ = 0x8000000000000000;
          auVar36 = vxorpd_avx512vl(auVar18,auVar15);
          auVar36 = vunpcklpd_avx(auVar36,local_198);
          pcVar10 = (this->cb).p._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar30][lVar32];
          auVar12 = vfmadd213pd_fma(auVar12,auVar36,
                                    *(undefined1 (*) [16])((long)&pcVar10->by + lVar33));
          *(undefined1 (*) [16])((long)&pcVar10->by + lVar33) = auVar12;
        }
        lVar33 = lVar33 + 0x18;
      }
    }
  }
  return;
}

Assistant:

void spatial_region::add_beam(double cmr, double n0, double u0, double xb, double rb, double x0b, double y0b, double phib)
{
    /* Добавляет электронный пучок с полями, вычисленными в
     * приближении бесконечного гамма-фактора пучка. n0 - максимальная
     * концентрация электронов в пучке, нормированная на критическую
     * концентрацию. phib - направление (в плоскости xy), в котором пучок распространяется
     */

    int_vector3d a,b;
    b.i = xnpic;
    b.j = ynpic;
    b.k = znpic;
    double x, y, z, r, n, f_ampl, signum, type, phi;
    signum = (u0>0) - (u0<0);
    type = (cmr>0)-(cmr<0);
    for(int i=0; i<nx; i++)
    {
        for(int j=0; j<ny; j++)
        {
            for(int k=0; k<nz; k++)
            {
                a.i = i;
                a.j = j;
                a.k = k;
                phi = atan2((j-ny/2)*dy-y0b, i*dx-x0b);
                // x,y,z are in the rotated (by phib) coordinate system
                x = sqrt((i*dx-x0b)*(i*dx-x0b) + ((j-ny/2)*dy-y0b)*((j-ny/2)*dy-y0b)) * cos(phi - phib);
                y = sqrt((i*dx-x0b)*(i*dx-x0b) + ((j-ny/2)*dy-y0b)*((j-ny/2)*dy-y0b)) * sin(phi - phib);
                z = (k-nz/2)*dz;
                r = sqrt(y*y + z*z);
                if (x>-xb && x<xb && r<rb)
                {
                    n = n0*(1-x*x/(xb*xb))*(1-r*r/(rb*rb));
                    fill_cell_by_particles(cmr,a,b,n,u0*cos(phib),u0*sin(phib));
                    f_ampl = 0.5*n0*(1-x*x/(xb*xb))*(1-r*r/(2*rb*rb));
                    ce[i][j][k].ex -= type*f_ampl*y * sin(phib);
                    ce[i][j][k].ey += type*f_ampl*y * cos(phib);
                    ce[i][j][k].ez += type*f_ampl*z;
                    cb[i][j][k].bx += type*signum*f_ampl*z * sin(phib);
                    cb[i][j][k].by -= type*signum*f_ampl*z * cos(phib);
                    cb[i][j][k].bz += type*signum*f_ampl*y;
                }
                if (x>-xb && x<xb && r>=rb)
                {
                    f_ampl = 0.25*n0*(1-x*x/(xb*xb))*rb*rb/(r*r);
                    ce[i][j][k].ex -= type*f_ampl*y * sin(phib);
                    ce[i][j][k].ey += type*f_ampl*y * cos(phib);
                    ce[i][j][k].ez += type*f_ampl*z;
                    cb[i][j][k].bx += type*signum*f_ampl*z * sin(phib);
                    cb[i][j][k].by -= type*signum*f_ampl*z * cos(phib);
                    cb[i][j][k].bz += type*signum*f_ampl*y;
                }
            }
        }
    }
}